

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_scalar_rst(REF_NODE ref_node,REF_INT *ldim,REF_DBL **scalar,char *filename)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  uint local_19c;
  uint local_190;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  int i_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  uint local_98;
  uint uStack_94;
  char letter;
  int doubles;
  int version;
  int length;
  int i;
  REF_LONG nnode_read;
  REF_INT local;
  REF_INT node;
  REF_GLOB global;
  void *pvStack_68;
  REF_INT section_size;
  REF_DBL *data;
  uint local_58;
  REF_INT chunk;
  int dof;
  int steps;
  int step;
  int variables;
  int dim;
  REF_BOOL verbose;
  FILE *file;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_DBL **scalar_local;
  REF_INT *ldim_local;
  REF_NODE ref_node_local;
  
  file = (FILE *)ref_node->ref_mpi;
  variables = 1;
  _dim = (FILE *)0x0;
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)scalar;
  scalar_local = (REF_DBL **)ldim;
  ldim_local = &ref_node->n;
  if (*(int *)&file->field_0x4 == 0) {
    _dim = fopen(filename,"r");
    if (_dim == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (_dim == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xabc,
             "ref_part_scalar_rst","unable to open file");
      return 2;
    }
    sVar3 = fread(&doubles,4,1,_dim);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xabd,
             "ref_part_scalar_rst","dim",1,sVar3);
      return 1;
    }
    if (variables != 0) {
      printf("%d length of magic string\n",(ulong)(uint)doubles);
    }
    if ((long)doubles != 8) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xabf,
             "ref_part_scalar_rst","magic string length",8,(long)doubles);
      return 1;
    }
    for (version = 0; version < doubles; version = version + 1) {
      sVar3 = fread((void *)((long)&ref_private_status_reis_ai + 7),1,1,_dim);
      if (sVar3 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xac1,"ref_part_scalar_rst","dim",1,sVar3);
        return 1;
      }
      if (variables != 0) {
        printf("%c",(ulong)(uint)(int)ref_private_status_reis_ai._7_1_);
      }
    }
    if (variables != 0) {
      printf("\n");
    }
    sVar3 = fread(&stack0xffffffffffffff6c,4,1,_dim);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xac5,
             "ref_part_scalar_rst","dim",1,sVar3);
      return 1;
    }
    if (variables != 0) {
      printf("%d version\n",(ulong)uStack_94);
    }
    if ((long)(int)uStack_94 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xac7,
             "ref_part_scalar_rst","version",2,(long)(int)uStack_94);
      return 1;
    }
    sVar3 = fread(&step,4,1,_dim);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xac8,
             "ref_part_scalar_rst","dim",1,sVar3);
      return 1;
    }
    if (variables != 0) {
      printf("%d dim\n",(ulong)(uint)step);
    }
    if ((step < 2) || (3 < step)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xaca,
             "ref_part_scalar_rst","dim");
      return 1;
    }
    sVar3 = fread(&steps,4,1,_dim);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xacb,
             "ref_part_scalar_rst","variables",1,sVar3);
      return 1;
    }
    if (variables != 0) {
      printf("%d variables\n",(ulong)(uint)steps);
    }
    sVar3 = fread(&chunk,4,1,_dim);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xacd,
             "ref_part_scalar_rst","steps",1,sVar3);
      return 1;
    }
    if (variables != 0) {
      printf("%d steps\n",(ulong)(uint)chunk);
    }
    sVar3 = fread(&local_58,4,1,_dim);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xacf,
             "ref_part_scalar_rst","dof",1,sVar3);
      return 1;
    }
    if (variables != 0) {
      printf("%d dof\n",(ulong)local_58);
    }
    sVar3 = fread(&local_98,4,1,_dim);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xad1,
             "ref_part_scalar_rst","doubles",1,sVar3);
      return 1;
    }
    if (variables != 0) {
      printf("%d doubles\n",(ulong)local_98);
    }
    if ((long)(int)local_98 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xad3,
             "ref_part_scalar_rst","expected zero doubles",0,(long)(int)local_98);
      return 1;
    }
  }
  uVar1 = ref_mpi_bcast((REF_MPI)file,&step,1,1);
  if (uVar1 == 0) {
    uVar1 = ref_mpi_bcast((REF_MPI)file,&steps,1,1);
    if (uVar1 == 0) {
      uVar1 = ref_mpi_bcast((REF_MPI)file,&chunk,1,1);
      if (uVar1 == 0) {
        uVar1 = ref_mpi_bcast((REF_MPI)file,&local_58,1,1);
        if (uVar1 == 0) {
          if (*(long *)(ldim_local + 0x1a) != (long)(int)local_58) {
            if (*(int *)&file->field_0x4 == 0) {
              printf("file dof %d ref_node %ld %s\n",(ulong)local_58,
                     *(undefined8 *)(ldim_local + 0x1a),ref_mpi);
            }
            if ((long)(int)local_58 < *(long *)(ldim_local + 0x1a)) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xae1,"ref_part_scalar_rst","ERROR: too small global dof");
              return 1;
            }
          }
          *(int *)scalar_local = steps * chunk;
          if (*(int *)scalar_local * ldim_local[1] < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xae6,"ref_part_scalar_rst","malloc *scalar of REF_DBL negative");
            ref_node_local._4_4_ = 1;
          }
          else {
            pvVar4 = malloc((long)(*(int *)scalar_local * ldim_local[1]) << 3);
            *(void **)filename_local = pvVar4;
            if (*(long *)filename_local == 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xae6,"ref_part_scalar_rst","malloc *scalar of REF_DBL NULL");
              ref_node_local._4_4_ = 2;
            }
            else {
              if ((long)(int)local_58 / (long)**(int **)(ldim_local + 0x14) < 100000) {
                local_190 = 100000;
              }
              else {
                local_190 = (int)local_58 / **(int **)(ldim_local + 0x14);
              }
              data._4_4_ = local_58;
              if ((int)local_190 < (int)local_58) {
                data._4_4_ = local_190;
              }
              if ((int)(steps * data._4_4_) < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xaec,"ref_part_scalar_rst","malloc data of REF_DBL negative");
                ref_node_local._4_4_ = 1;
              }
              else {
                pvStack_68 = malloc((long)(int)(steps * data._4_4_) << 3);
                if (pvStack_68 == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xaec,"ref_part_scalar_rst","malloc data of REF_DBL NULL");
                  ref_node_local._4_4_ = 2;
                }
                else {
                  for (ref_private_status_reis_ai_11._4_4_ = 0;
                      ref_private_status_reis_ai_11._4_4_ < (int)(steps * data._4_4_);
                      ref_private_status_reis_ai_11._4_4_ = ref_private_status_reis_ai_11._4_4_ + 1)
                  {
                    *(undefined8 *)
                     ((long)pvStack_68 + (long)ref_private_status_reis_ai_11._4_4_ * 8) =
                         0xbff0000000000000;
                  }
                  for (dof = 0; dof < chunk; dof = dof + 1) {
                    for (_length = 0; _length < (int)local_58; _length = (int)global._4_4_ + _length
                        ) {
                      if ((int)data._4_4_ < (int)(local_58 - (int)_length)) {
                        local_19c = data._4_4_;
                      }
                      else {
                        local_19c = local_58 - (int)_length;
                      }
                      global._4_4_ = local_19c;
                      if (*(int *)(*(long *)(ldim_local + 0x14) + 4) == 0) {
                        iVar2 = steps * local_19c;
                        sVar3 = fread(pvStack_68,8,(long)(int)(steps * local_19c),_dim);
                        if ((long)iVar2 != sVar3) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xaf7,"ref_part_scalar_rst","dat",(long)iVar2,sVar3);
                          return 1;
                        }
                        uVar1 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),pvStack_68,
                                              steps * data._4_4_,3);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xafa,"ref_part_scalar_rst",(ulong)uVar1,"bcast");
                          return uVar1;
                        }
                      }
                      else {
                        uVar1 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),pvStack_68,
                                              steps * data._4_4_,3);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xafe,"ref_part_scalar_rst",(ulong)uVar1,"bcast");
                          return uVar1;
                        }
                      }
                      for (nnode_read._4_4_ = 0; nnode_read._4_4_ < (int)global._4_4_;
                          nnode_read._4_4_ = nnode_read._4_4_ + 1) {
                        _local = nnode_read._4_4_ + _length;
                        uVar1 = ::ref_node_local((REF_NODE)ldim_local,_local,(REF_INT *)&nnode_read)
                        ;
                        if ((uVar1 != 0) && (uVar1 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xb02,"ref_part_scalar_rst",(ulong)uVar1,"local");
                          return uVar1;
                        }
                        if ((int)nnode_read != -1) {
                          for (ref_private_status_reis_ai_11._0_4_ = 0;
                              (int)ref_private_status_reis_ai_11 < steps;
                              ref_private_status_reis_ai_11._0_4_ =
                                   (int)ref_private_status_reis_ai_11 + 1) {
                            *(undefined8 *)
                             (*(long *)filename_local +
                             (long)((int)ref_private_status_reis_ai_11 + dof * steps +
                                   (int)nnode_read * *(int *)scalar_local) * 8) =
                                 *(undefined8 *)
                                  ((long)pvStack_68 +
                                  (long)((int)ref_private_status_reis_ai_11 +
                                        nnode_read._4_4_ * steps) * 8);
                          }
                        }
                      }
                    }
                  }
                  if (pvStack_68 != (void *)0x0) {
                    free(pvStack_68);
                  }
                  if (*(int *)&file->field_0x4 == 0) {
                    fclose(_dim);
                  }
                  ref_node_local._4_4_ = 0;
                }
              }
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xad9,"ref_part_scalar_rst",(ulong)uVar1,"bcast dim");
          ref_node_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xad8,"ref_part_scalar_rst",(ulong)uVar1,"bcast dim");
        ref_node_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xad7,
             "ref_part_scalar_rst",(ulong)uVar1,"bcast dim");
      ref_node_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xad6,
           "ref_part_scalar_rst",(ulong)uVar1,"bcast dim");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_scalar_rst(REF_NODE ref_node, REF_INT *ldim,
                                              REF_DBL **scalar,
                                              const char *filename) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  FILE *file;
  REF_BOOL verbose = REF_TRUE;
  int dim, variables, step, steps, dof;
  REF_INT chunk;
  REF_DBL *data;
  REF_INT section_size;
  REF_GLOB global;
  REF_INT node, local;
  REF_LONG nnode_read;

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    int i, length, version, doubles;
    char letter;
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    REIS(1, fread(&length, sizeof(length), 1, file), "dim");
    if (verbose) printf("%d length of magic string\n", length);
    REIS(8, length, "magic string length");
    for (i = 0; i < length; i++) {
      REIS(1, fread(&letter, sizeof(letter), 1, file), "dim");
      if (verbose) printf("%c", letter);
    }
    if (verbose) printf("\n");
    REIS(1, fread(&version, sizeof(version), 1, file), "dim");
    if (verbose) printf("%d version\n", version);
    REIS(2, version, "version");
    REIS(1, fread(&dim, sizeof(dim), 1, file), "dim");
    if (verbose) printf("%d dim\n", dim);
    RAS(2 <= dim && dim <= 3, "dim");
    REIS(1, fread(&variables, sizeof(variables), 1, file), "variables");
    if (verbose) printf("%d variables\n", variables);
    REIS(1, fread(&steps, sizeof(steps), 1, file), "steps");
    if (verbose) printf("%d steps\n", steps);
    REIS(1, fread(&dof, sizeof(dof), 1, file), "dof");
    if (verbose) printf("%d dof\n", dof);
    REIS(1, fread(&doubles, sizeof(doubles), 1, file), "doubles");
    if (verbose) printf("%d doubles\n", doubles);
    REIS(0, doubles, "expected zero doubles");
    /* assert zero doubles, skip misc metadata (timestep) */
  }
  RSS(ref_mpi_bcast(ref_mpi, &dim, 1, REF_INT_TYPE), "bcast dim");
  RSS(ref_mpi_bcast(ref_mpi, &variables, 1, REF_INT_TYPE), "bcast dim");
  RSS(ref_mpi_bcast(ref_mpi, &steps, 1, REF_INT_TYPE), "bcast dim");
  RSS(ref_mpi_bcast(ref_mpi, &dof, 1, REF_INT_TYPE), "bcast dim");

  if (ref_node_n_global(ref_node) != dof) {
    if (ref_mpi_once(ref_mpi)) {
      printf("file dof %d ref_node " REF_GLOB_FMT " %s\n", dof,
             ref_node_n_global(ref_node), filename);
    }
    if (ref_node_n_global(ref_node) > dof) {
      THROW("ERROR: too small global dof");
    }
  }

  *ldim = variables * steps;
  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  chunk =
      (REF_INT)MAX(100000, dof / (REF_LONG)ref_mpi_n(ref_node_mpi(ref_node)));
  chunk = (REF_INT)MIN((REF_LONG)chunk, dof);

  ref_malloc_init(data, variables * chunk, REF_DBL, -1.0);

  for (step = 0; step < steps; step++) {
    int i;
    nnode_read = 0;
    while (nnode_read < dof) {
      section_size = MIN(chunk, (REF_INT)(dof - nnode_read));
      if (ref_mpi_once(ref_node_mpi(ref_node))) {
        REIS((variables)*section_size,
             fread(data, sizeof(REF_DBL), (size_t)(variables * section_size),
                   file),
             "dat");
        RSS(ref_mpi_bcast(ref_node_mpi(ref_node), data, variables * chunk,
                          REF_DBL_TYPE),
            "bcast");
      } else {
        RSS(ref_mpi_bcast(ref_node_mpi(ref_node), data, variables * chunk,
                          REF_DBL_TYPE),
            "bcast");
      }
      for (node = 0; node < section_size; node++) {
        global = node + nnode_read;
        RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
        if (REF_EMPTY != local) {
          for (i = 0; i < variables; i++) {
            (*scalar)[i + step * variables + local * (*ldim)] =
                data[i + node * variables];
          }
        }
      }
      nnode_read += (REF_LONG)section_size;
    }
  }
  ref_free(data);

  if (ref_mpi_once(ref_mpi)) {
    fclose(file);
  }
  return REF_SUCCESS;
}